

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateStaticVariables
          (MessageGenerator *this,Printer *printer)

{
  mapped_type *pmVar1;
  Descriptor *pDVar2;
  long *plVar3;
  Descriptor *in_RDX;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  long lVar4;
  long lVar5;
  allocator<char> local_a1;
  string local_a0;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  if (*(int *)(*(long *)(*(long *)((_anonymous_namespace_ *)this->descriptor_ + 0x10) + 0x88) + 0x50
              ) != 3) {
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    (anonymous_namespace)::UniqueFileScopeIdentifier_abi_cxx11_
              (&local_a0,(_anonymous_namespace_ *)this->descriptor_,in_RDX);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"identifier",&local_a1);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_80);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    pDVar2 = this->descriptor_;
    plVar3 = (long *)(*(long *)(pDVar2 + 0x10) + 0x50);
    if (*(long *)(pDVar2 + 0x18) != 0) {
      plVar3 = (long *)(*(long *)(pDVar2 + 0x18) + 0x40);
    }
    SimpleItoa_abi_cxx11_
              (&local_a0,(protobuf *)(((long)pDVar2 - *plVar3) / 0x78 & 0xffffffff),
               (int)(((long)pDVar2 - *plVar3) % 0x78));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"index",&local_a1);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_80);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    ClassName_abi_cxx11_(&local_a0,(java *)this->descriptor_,descriptor);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"classname",&local_a1);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_80);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    pDVar2 = this->descriptor_;
    if (*(_anonymous_namespace_ **)(pDVar2 + 0x18) != (_anonymous_namespace_ *)0x0) {
      (anonymous_namespace)::UniqueFileScopeIdentifier_abi_cxx11_
                (&local_a0,*(_anonymous_namespace_ **)(pDVar2 + 0x18),descriptor_00);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"parent",&local_a1);
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_80);
      std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      pDVar2 = this->descriptor_;
    }
    if (*(char *)(*(long *)(*(long *)(pDVar2 + 0x10) + 0x88) + 0x54) == '\x01') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"private",(allocator<char> *)&local_80);
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_a0);
      std::__cxx11::string::assign((char *)pmVar1);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"private",(allocator<char> *)&local_80);
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_a0);
      std::__cxx11::string::assign((char *)pmVar1);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    io::Printer::Print(printer,&vars,
                       "$private$static com.google.protobuf.Descriptors.Descriptor\n  internal_$identifier$_descriptor;\n"
                      );
    io::Printer::Print(printer,&vars,
                       "$private$static\n  com.google.protobuf.GeneratedMessage.FieldAccessorTable\n    internal_$identifier$_fieldAccessorTable;\n"
                      );
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vars._M_t);
  }
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(this->descriptor_ + 0x38); lVar4 = lVar4 + 1) {
    MessageGenerator((MessageGenerator *)&vars,
                     (Descriptor *)(*(long *)(this->descriptor_ + 0x40) + lVar5));
    GenerateStaticVariables((MessageGenerator *)&vars,printer);
    FieldGeneratorMap::~FieldGeneratorMap
              ((FieldGeneratorMap *)&vars._M_t._M_impl.super__Rb_tree_header);
    lVar5 = lVar5 + 0x78;
  }
  return;
}

Assistant:

void MessageGenerator::GenerateStaticVariables(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_)) {
    // Because descriptor.proto (com.google.protobuf.DescriptorProtos) is
    // used in the construction of descriptors, we have a tricky bootstrapping
    // problem.  To help control static initialization order, we make sure all
    // descriptors and other static data that depends on them are members of
    // the outermost class in the file.  This way, they will be initialized in
    // a deterministic order.

    map<string, string> vars;
    vars["identifier"] = UniqueFileScopeIdentifier(descriptor_);
    vars["index"] = SimpleItoa(descriptor_->index());
    vars["classname"] = ClassName(descriptor_);
    if (descriptor_->containing_type() != NULL) {
      vars["parent"] = UniqueFileScopeIdentifier(
          descriptor_->containing_type());
    }
    if (descriptor_->file()->options().java_multiple_files()) {
      // We can only make these package-private since the classes that use them
      // are in separate files.
      vars["private"] = "";
    } else {
      vars["private"] = "private ";
    }

    // The descriptor for this type.
    printer->Print(vars,
      "$private$static com.google.protobuf.Descriptors.Descriptor\n"
      "  internal_$identifier$_descriptor;\n");

    // And the FieldAccessorTable.
    printer->Print(vars,
      "$private$static\n"
      "  com.google.protobuf.GeneratedMessage.FieldAccessorTable\n"
      "    internal_$identifier$_fieldAccessorTable;\n");
  }

  // Generate static members for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    MessageGenerator(descriptor_->nested_type(i))
      .GenerateStaticVariables(printer);
  }
}